

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O1

bool Js::VarIs<Js::JavascriptStringObject>(Var aValue)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/RecyclableObject.h"
                                ,0x1ec,"(aValue != nullptr)","VarIs: aValue is null");
    if (!bVar3) goto LAB_00aa00f3;
    *puVar5 = 0;
  }
  if ((ulong)aValue >> 0x30 == 0) {
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00aa00f3;
      *puVar5 = 0;
    }
    iVar1 = **(int **)((long)aValue + 8);
    if (0x57 < iVar1) {
      BVar4 = RecyclableObject::IsExternal((RecyclableObject *)aValue);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00aa00f3:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
    bVar3 = iVar1 == 0x27;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool VarIs(Var aValue)
    {
        AssertMsg(aValue != nullptr, "VarIs: aValue is null");

#if INT32VAR
        bool isRecyclableObject = (((uintptr_t)aValue) >> VarTag_Shift) == 0;
#else
        bool isRecyclableObject = (((uintptr_t)aValue) & AtomTag) == AtomTag_Object;
#endif

        return isRecyclableObject && VarIsImpl<T>(reinterpret_cast<RecyclableObject*>(aValue));
    }